

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_uint stb_crc32_block(stb_uint crc,uchar *buffer,stb_uint len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  if (stb_crc32_block::crc_table[1] == 0) {
    for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
      iVar4 = 8;
      uVar3 = uVar2 & 0xffffffff;
      while( true ) {
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) break;
        uVar3 = (ulong)(-((uint)uVar3 & 1) & 0xedb88320 ^ (uint)(uVar3 >> 1));
      }
      stb_crc32_block::crc_table[uVar2] = (uint)uVar3;
    }
  }
  uVar1 = ~crc;
  for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 >> 8 ^ stb_crc32_block::crc_table[uVar1 & 0xff ^ (uint)buffer[uVar2]];
  }
  return ~uVar1;
}

Assistant:

stb_uint stb_crc32_block(stb_uint crc, unsigned char *buffer, stb_uint len)
{
   static stb_uint crc_table[256];
   stb_uint i,j,s;
   crc = ~crc;

   if (crc_table[1] == 0)
      for(i=0; i < 256; i++) {
         for (s=i, j=0; j < 8; ++j)
            s = (s >> 1) ^ (s & 1 ? 0xedb88320 : 0);
         crc_table[i] = s;
      }
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}